

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O2

_Bool gen_store(DisasContext_conflict12 *ctx,arg_sb *a,MemOp memop)

{
  TCGContext_conflict11 *tcg_ctx;
  undefined1 extraout_AL;
  TCGv_i64 t;
  TCGv_i64 t_00;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  gen_get_gpr(tcg_ctx,t,a->rs1);
  tcg_gen_addi_i64_riscv64(tcg_ctx,t,t,(long)a->imm);
  gen_get_gpr(tcg_ctx,t_00,a->rs2);
  tcg_gen_qemu_st_i64_riscv64(tcg_ctx,t_00,t,(ulong)ctx->mem_idx,memop);
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  return (_Bool)extraout_AL;
}

Assistant:

static bool gen_store(DisasContext *ctx, arg_sb *a, MemOp memop)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv dat = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, t0, a->rs1);
    tcg_gen_addi_tl(tcg_ctx, t0, t0, a->imm);
    gen_get_gpr(tcg_ctx, dat, a->rs2);

    tcg_gen_qemu_st_tl(tcg_ctx, dat, t0, ctx->mem_idx, memop);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, dat);
    return true;
}